

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePath.cxx
# Opt level: O0

cmCMakePath * __thiscall cmCMakePath::ReplaceWideExtension(cmCMakePath *this,string_view extension)

{
  bool bVar1;
  ulong uVar2;
  const_reference pvVar3;
  path local_d0;
  allocator<char> local_a1;
  string local_a0 [32];
  ulong local_80;
  size_type pos;
  path local_68;
  undefined1 local_40 [8];
  string file;
  cmCMakePath *this_local;
  string_view extension_local;
  
  extension_local._M_len = (size_t)extension._M_str;
  this_local = (cmCMakePath *)extension._M_len;
  file.field_2._8_8_ = this;
  std::filesystem::__cxx11::path::filename(&local_68,&this->Path);
  std::filesystem::__cxx11::path::string((string *)local_40,&local_68);
  std::filesystem::__cxx11::path::~path(&local_68);
  uVar2 = std::__cxx11::string::empty();
  if ((((uVar2 & 1) == 0) &&
      (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_40,"."), bVar1)) &&
     (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,".."), bVar1)) {
    std::__cxx11::string::operator[]((ulong)local_40);
    local_80 = std::__cxx11::string::find((char)local_40,0x2e);
    if (local_80 != 0xffffffffffffffff) {
      std::__cxx11::string::erase((ulong)local_40,local_80);
    }
  }
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if (!bVar1) {
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,0);
    if (*pvVar3 != '.') {
      std::__cxx11::string::operator+=((string *)local_40,'.');
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (local_a0,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,&local_a1);
    std::__cxx11::string::append((string *)local_40);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator(&local_a1);
  }
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
             ,auto_format);
  std::filesystem::__cxx11::path::replace_filename(&this->Path);
  std::filesystem::__cxx11::path::~path(&local_d0);
  std::__cxx11::string::~string((string *)local_40);
  return this;
}

Assistant:

cmCMakePath& cmCMakePath::ReplaceWideExtension(cm::string_view extension)
{
  auto file = this->Path.filename().string();
  if (!file.empty() && file != "." && file != "..") {
    auto pos = file.find('.', file[0] == '.' ? 1 : 0);
    if (pos != std::string::npos) {
      file.erase(pos);
    }
  }
  if (!extension.empty()) {
    if (extension[0] != '.') {
      file += '.';
    }
    file.append(std::string(extension));
  }
  this->Path.replace_filename(file);
  return *this;
}